

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyTable.cpp
# Opt level: O2

Var Js::WebAssemblyTable::EntryGrow(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  Var pvVar6;
  WebAssemblyTable *pWVar7;
  RecyclableObject *val;
  Recycler *this;
  WriteBarrierPtr<void> *dst;
  uint uVar8;
  ulong count;
  Type nValue;
  int in_stack_00000010;
  undefined1 local_80 [8];
  TrackAllocData data;
  CallInfo callInfo_local;
  undefined1 local_48 [8];
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  data._32_8_ = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyTable.cpp"
                                ,0x5a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00c1fb8f;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_48,(CallInfo *)&data.line,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((data._32_8_ & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyTable.cpp"
                                ,0x5d,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00c1fb8f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if ((local_48._0_4_ & 0xffffff) != 0) {
    pvVar6 = Arguments::operator[]((Arguments *)local_48,0);
    bVar3 = VarIs<Js::WebAssemblyTable>(pvVar6);
    if (bVar3) {
      pvVar6 = Arguments::operator[]((Arguments *)local_48,0);
      pWVar7 = VarTo<Js::WebAssemblyTable>(pvVar6);
      nValue = pWVar7->m_currentLength;
      if ((local_48._0_4_ & 0xfffffe) == 0) {
        val = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
              undefinedValue.ptr;
      }
      else {
        val = (RecyclableObject *)Arguments::operator[]((Arguments *)local_48,1);
      }
      uVar4 = WebAssembly::ToNonWrappingUint32(val,pSVar1);
      if (uVar4 != 0) {
        uVar8 = uVar4 + pWVar7->m_currentLength;
        args.super_Arguments.Values._4_4_ = nValue;
        if ((CARRY4(uVar4,pWVar7->m_currentLength)) || (pWVar7->m_maxLength < uVar8)) {
          JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ebf6,(PCWSTR)0x0);
        }
        count = (ulong)uVar8;
        local_80 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.count = (size_t)anon_var_dwarf_95534bf;
        data.filename._0_4_ = 0x70;
        data.plusSize = count;
        this = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)local_80);
        dst = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                        ((Memory *)this,(Recycler *)Memory::Recycler::AllocZero,0,count);
        Memory::
        CopyArray<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
                  (dst,count,&pWVar7->m_values,(ulong)pWVar7->m_currentLength);
        Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet
                  (&pWVar7->m_values,dst);
        pWVar7->m_currentLength = uVar8;
        nValue = args.super_Arguments.Values._4_4_;
      }
      pvVar6 = JavascriptNumber::ToVar(nValue,pSVar1);
      return pvVar6;
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5e49c,(PCWSTR)0x0);
}

Assistant:

Var
WebAssemblyTable::EntryGrow(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count == 0 || !VarIs<WebAssemblyTable>(args[0]))
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedTableObject);
    }
    WebAssemblyTable * table = VarTo<WebAssemblyTable>(args[0]);
    uint32 oldLength = table->m_currentLength;

    Var deltaVar = args.Info.Count >= 2 ? args[1] : scriptContext->GetLibrary()->GetUndefined();
    uint32 delta = WebAssembly::ToNonWrappingUint32(deltaVar, scriptContext);
    if (delta > 0)
    {
        uint32 newLength = 0;
        if (UInt32Math::Add(table->m_currentLength, delta, &newLength) || newLength > table->m_maxLength)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange);
        }

        Field(Var) * newValues = RecyclerNewArrayZ(scriptContext->GetRecycler(), Field(Var), newLength);
        CopyArray(newValues, newLength, table->m_values, table->m_currentLength);

        table->m_values = newValues;
        table->m_currentLength = newLength;
    }

    return JavascriptNumber::ToVar(oldLength, scriptContext);
}